

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

void __thiscall MemorySSADumper::dumpBBlockDefinitions(MemorySSADumper *this,RWBBlock *block)

{
  BBlockInfo *pBVar1;
  
  pBVar1 = dg::dda::MemorySSATransformation::getBBlockInfo
                     (*(MemorySSATransformation **)
                       (((this->super_Dumper).DDA)->DDA)._M_t.
                       super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                       .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>._M_head_impl
                      ,block);
  if (pBVar1 != (BBlockInfo *)0x0) {
    printf("<tr><td colspan=\"4\">==  defines ==</td></tr>");
    dumpDDIMap(this,&(pBVar1->definitions).definitions);
    printf("<tr><td colspan=\"4\">==  kills ==</td></tr>");
    dumpDDIMap(this,&(pBVar1->definitions).kills);
    return;
  }
  return;
}

Assistant:

void dumpBBlockDefinitions(RWBBlock *block) override {
        auto *SSA = static_cast<MemorySSATransformation *>(
                DDA->getDDA()->getImpl());
        const auto *D = SSA->getDefinitions(block);
        if (!D)
            return;
        printf("<tr><td colspan=\"4\">==  defines ==</td></tr>");
        dumpDDIMap(D->definitions);
        printf("<tr><td colspan=\"4\">==  kills ==</td></tr>");
        dumpDDIMap(D->kills);
    }